

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

int gen_neon_unzip(TCGContext_conflict1 *tcg_ctx,int rd,int rm,int size,int q)

{
  int iVar1;
  TCGv_ptr pTVar2;
  TCGv_ptr pTVar3;
  int reg;
  code *func;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *local_38;
  TCGv_ptr local_30;
  
  iVar1 = 1;
  if (size != 2 || q != 0) {
    pTVar2 = vfp_reg_ptr(tcg_ctx,SUB41(rd,0),rm);
    pTVar3 = vfp_reg_ptr(tcg_ctx,SUB41(rm,0),reg);
    if (q == 0) {
      if (size == 1) {
        func = helper_neon_unzip16_aarch64;
      }
      else {
        if (size != 0) {
LAB_00653795:
          abort();
        }
        func = helper_neon_unzip8_aarch64;
      }
    }
    else if (size == 2) {
      func = helper_neon_qunzip32_aarch64;
    }
    else if (size == 1) {
      func = helper_neon_qunzip16_aarch64;
    }
    else {
      if (size != 0) goto LAB_00653795;
      func = helper_neon_qunzip8_aarch64;
    }
    local_30 = pTVar3 + (long)&tcg_ctx->pool_cur;
    local_38 = (TCGTemp *)(pTVar2 + (long)&tcg_ctx->pool_cur);
    tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)0x0,2,&local_38);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int gen_neon_unzip(TCGContext *tcg_ctx, int rd, int rm, int size, int q)
{
    TCGv_ptr pd, pm;
    
    if (!q && size == 2) {
        return 1;
    }
    pd = vfp_reg_ptr(tcg_ctx, true, rd);
    pm = vfp_reg_ptr(tcg_ctx, true, rm);
    if (q) {
        switch (size) {
        case 0:
            gen_helper_neon_qunzip8(tcg_ctx, pd, pm);
            break;
        case 1:
            gen_helper_neon_qunzip16(tcg_ctx, pd, pm);
            break;
        case 2:
            gen_helper_neon_qunzip32(tcg_ctx, pd, pm);
            break;
        default:
            abort();
        }
    } else {
        switch (size) {
        case 0:
            gen_helper_neon_unzip8(tcg_ctx, pd, pm);
            break;
        case 1:
            gen_helper_neon_unzip16(tcg_ctx, pd, pm);
            break;
        default:
            abort();
        }
    }
    tcg_temp_free_ptr(tcg_ctx, pd);
    tcg_temp_free_ptr(tcg_ctx, pm);
    return 0;
}